

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

address * __thiscall libtorrent::aux::torrent_peer::address(torrent_peer *this)

{
  peer_connection_interface *ppVar1;
  address *in_RDI;
  
  if ((*(uint *)&this->field_0x1b >> 0x18 & 1) == 0) {
    if ((*(uint *)&this->field_0x1b >> 0x19 & 1) != 0) {
      *(undefined8 *)((long)&(in_RDI->ipv6_address_).addr_.__in6_u + 8) = 0;
      (in_RDI->ipv6_address_).scope_id_ = 0;
      in_RDI->type_ = ipv4;
      in_RDI->ipv4_address_ = (in4_addr_type)0x0;
      *(undefined8 *)&(in_RDI->ipv6_address_).addr_.__in6_u = 0;
      return in_RDI;
    }
    in_RDI->type_ = ipv4;
    (in_RDI->ipv4_address_).addr_.s_addr = this[1].prev_amount_upload;
    *(undefined8 *)&(in_RDI->ipv6_address_).addr_.__in6_u = 0;
    *(undefined8 *)((long)&(in_RDI->ipv6_address_).addr_.__in6_u + 8) = 0;
  }
  else {
    ppVar1 = this[1].connection;
    *(undefined8 *)&(in_RDI->ipv6_address_).addr_.__in6_u = *(undefined8 *)(this + 1);
    *(peer_connection_interface **)((long)&(in_RDI->ipv6_address_).addr_.__in6_u + 8) = ppVar1;
    in_RDI->type_ = ipv6;
    in_RDI->ipv4_address_ = (in4_addr_type)0x0;
  }
  (in_RDI->ipv6_address_).scope_id_ = 0;
  return in_RDI;
}

Assistant:

libtorrent::address torrent_peer::address() const
	{
		if (is_v6_addr)
			return libtorrent::address_v6(
				static_cast<ipv6_peer const*>(this)->addr);
		else
#if TORRENT_USE_I2P
		if (is_i2p_addr) return {};
		else
#endif
#if TORRENT_USE_RTC
		if (is_rtc_addr) return static_cast<rtc_peer const*>(this)->endpoint.address();
		else
#endif
		return static_cast<ipv4_peer const*>(this)->addr;
	}